

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5SentenceFinderCb
              (void *pContext,int tflags,char *pToken,int nToken,int iStartOff,int iEndOff)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  Fts5SFinder *p;
  int iAdd;
  ulong uVar5;
  
  if ((tflags & 1U) != 0) {
    return 0;
  }
  iAdd = *pContext;
  if (iAdd < 1) {
    iAdd = 0;
  }
  else {
    uVar3 = iStartOff - 1;
    if (iStartOff < 1) {
      uVar5 = (ulong)uVar3;
      bVar4 = 0;
    }
    else {
      uVar5 = (ulong)uVar3;
      do {
        bVar4 = *(byte *)(*(long *)((long)pContext + 0x18) + uVar5);
        if ((0x20 < (ulong)bVar4) || ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) == 0))
        goto LAB_001b0218;
        bVar1 = 0 < (long)uVar5;
        uVar5 = uVar5 - 1;
      } while (bVar1);
      uVar5 = 0xffffffff;
    }
LAB_001b0218:
    iVar2 = 0;
    if (((uint)uVar5 == uVar3) || ((bVar4 != 0x3a && (iVar2 = 0, bVar4 != 0x2e))))
    goto LAB_001b0231;
  }
  iVar2 = fts5SentenceFinderAdd((Fts5SFinder *)pContext,iAdd);
LAB_001b0231:
  *(int *)pContext = *pContext + 1;
  return iVar2;
}

Assistant:

static int fts5SentenceFinderCb(
  void *pContext,                 /* Pointer to HighlightContext object */
  int tflags,                     /* Mask of FTS5_TOKEN_* flags */
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iStartOff,                  /* Start offset of token */
  int iEndOff                     /* End offset of token */
){
  int rc = SQLITE_OK;

  UNUSED_PARAM2(pToken, nToken);
  UNUSED_PARAM(iEndOff);

  if( (tflags & FTS5_TOKEN_COLOCATED)==0 ){
    Fts5SFinder *p = (Fts5SFinder*)pContext;
    if( p->iPos>0 ){
      int i;
      char c = 0;
      for(i=iStartOff-1; i>=0; i--){
        c = p->zDoc[i];
        if( c!=' ' && c!='\t' && c!='\n' && c!='\r' ) break;
      }
      if( i!=iStartOff-1 && (c=='.' || c==':') ){
        rc = fts5SentenceFinderAdd(p, p->iPos);
      }
    }else{
      rc = fts5SentenceFinderAdd(p, 0);
    }
    p->iPos++;
  }
  return rc;
}